

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_inquisitor.cpp
# Opt level: O3

int AF_A_InquisitorAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  PClassActor *pPVar7;
  AActor *pAVar8;
  uint uVar9;
  AActor *self;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  bool bVar12;
  double z;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f4dcc;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f4dbc;
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005f4b9d;
    pPVar6 = (self->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (self->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar11 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar6 == pPVar4;
    if (!bVar12 && !bVar11) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar4) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar10 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar9 = (uint)bVar11;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f4dcc;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005f4dbc;
LAB_005f4b9d:
    self = (AActor *)0x0;
    pVVar10 = param;
    uVar9 = numparam;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_005f4dbc:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005f4dcc;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar3[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar10,uVar9,ret);
            puVar3[1] = pPVar6;
          }
          bVar11 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar4 && bVar11) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar11 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar4) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar11) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005f4dcc;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_005f4dbc;
    }
    if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005f4dcc:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_inquisitor.cpp"
                    ,0x37,
                    "int AF_A_InquisitorAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  A_FaceTarget(self);
  dVar1 = (self->Angles).Yaw.Degrees;
  z = (self->__Pos).Z + 32.0;
  (self->__Pos).Z = z;
  (self->Angles).Yaw.Degrees = dVar1 + -1.40625;
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_005f4ccd:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_005f4ccd;
  }
  pPVar7 = PClass::FindActor("InquisitorShot");
  pAVar8 = P_SpawnMissileZAimed(self,z,pAVar8,pPVar7);
  if (pAVar8 != (AActor *)0x0) {
    (pAVar8->Vel).Z = (pAVar8->Vel).Z + 9.0;
  }
  dVar1 = (self->__Pos).Z;
  (self->Angles).Yaw.Degrees = (self->Angles).Yaw.Degrees + 2.8125;
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005f4d51;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar8 = (AActor *)0x0;
LAB_005f4d51:
  pPVar7 = PClass::FindActor("InquisitorShot");
  pAVar8 = P_SpawnMissileZAimed(self,dVar1,pAVar8,pPVar7);
  if (pAVar8 != (AActor *)0x0) {
    (pAVar8->Vel).Z = (pAVar8->Vel).Z + 16.0;
  }
  (self->__Pos).Z = (self->__Pos).Z + -32.0;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_InquisitorAttack)
{
	PARAM_ACTION_PROLOGUE;

	AActor *proj;

	if (self->target == NULL)
		return 0;

	A_FaceTarget (self);

	self->AddZ(32);
	self->Angles.Yaw -= 45./32;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 9;
	}
	self->Angles.Yaw += 45./16;
	proj = P_SpawnMissileZAimed (self, self->Z(), self->target, PClass::FindActor("InquisitorShot"));
	if (proj != NULL)
	{
		proj->Vel.Z += 16;
	}
	self->AddZ(-32);
	return 0;
}